

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_octahedron_transform.cc
# Opt level: O3

bool __thiscall
draco::AttributeOctahedronTransform::InverseTransformAttribute
          (AttributeOctahedronTransform *this,PointAttribute *attribute,
          PointAttribute *target_attribute)

{
  undefined8 uVar1;
  ValueType VVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  long lVar6;
  undefined8 *puVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  if ((((target_attribute->super_GeometryAttribute).data_type_ == DT_FLOAT32) &&
      ((target_attribute->super_GeometryAttribute).num_components_ == '\x03')) &&
     (this->quantization_bits_ - 2U < 0x1d)) {
    VVar2 = target_attribute->num_unique_entries_;
    if (VVar2 != 0) {
      uVar8 = (1 << ((byte)this->quantization_bits_ & 0x1f)) - 2;
      fVar9 = (float)(int)uVar8;
      lVar3 = (long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      lVar4 = (attribute->super_GeometryAttribute).byte_offset_;
      puVar7 = (undefined8 *)
               ((long)(((target_attribute->super_GeometryAttribute).buffer_)->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start +
               (target_attribute->super_GeometryAttribute).byte_offset_);
      lVar6 = 0;
      do {
        uVar1 = *(undefined8 *)(lVar3 + lVar4 + lVar6 * 8);
        fVar10 = (float)(int)uVar1 * (2.0 / fVar9) + -1.0;
        fVar11 = (float)(int)((ulong)uVar1 >> 0x20) * (2.0 / fVar9) + -1.0;
        fVar12 = (1.0 - ABS(fVar10)) - ABS(fVar11);
        fVar15 = 0.0;
        fVar16 = 0.0;
        if (0.0 <= -fVar12) {
          fVar16 = -fVar12;
        }
        fVar13 = 0.0;
        fVar14 = 0.0;
        auVar5._4_4_ = -(uint)(fVar10 < 0.0);
        auVar5._0_4_ = -(uint)(fVar10 < 0.0);
        auVar5._8_4_ = -(uint)(fVar11 < 0.0);
        auVar5._12_4_ = -(uint)(fVar11 < 0.0);
        uVar8 = movmskpd(uVar8,auVar5);
        fVar17 = fVar16;
        if ((uVar8 & 1) == 0) {
          fVar17 = -fVar16;
        }
        if ((uVar8 & 2) == 0) {
          fVar16 = -fVar16;
        }
        fVar10 = fVar10 + fVar17;
        fVar11 = fVar11 + fVar16;
        fVar16 = fVar11 * fVar11 + fVar12 * fVar12 + fVar10 * fVar10;
        if (1e-06 <= fVar16) {
          fVar14 = 1.0 / SQRT(fVar16);
          fVar15 = fVar11 * fVar14;
          fVar13 = fVar14 * fVar12;
          fVar14 = fVar14 * fVar10;
        }
        *puVar7 = CONCAT44(fVar14,fVar13);
        *(float *)(puVar7 + 1) = fVar15;
        puVar7 = (undefined8 *)((long)puVar7 + 0xc);
        lVar6 = lVar6 + 1;
      } while (VVar2 != (ValueType)lVar6);
    }
    return true;
  }
  return false;
}

Assistant:

bool AttributeOctahedronTransform::InverseTransformAttribute(
    const PointAttribute &attribute, PointAttribute *target_attribute) {
  if (target_attribute->data_type() != DT_FLOAT32) {
    return false;
  }

  const int num_points = target_attribute->size();
  const int num_components = target_attribute->num_components();
  if (num_components != 3) {
    return false;
  }
  constexpr int kEntrySize = sizeof(float) * 3;
  float att_val[3];
  const int32_t *source_attribute_data = reinterpret_cast<const int32_t *>(
      attribute.GetAddress(AttributeValueIndex(0)));
  uint8_t *target_address =
      target_attribute->GetAddress(AttributeValueIndex(0));
  OctahedronToolBox octahedron_tool_box;
  if (!octahedron_tool_box.SetQuantizationBits(quantization_bits_)) {
    return false;
  }
  for (uint32_t i = 0; i < num_points; ++i) {
    const int32_t s = *source_attribute_data++;
    const int32_t t = *source_attribute_data++;
    octahedron_tool_box.QuantizedOctahedralCoordsToUnitVector(s, t, att_val);

    // Store the decoded floating point values into the attribute buffer.
    std::memcpy(target_address, att_val, kEntrySize);
    target_address += kEntrySize;
  }
  return true;
}